

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::addSatUI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  Literal *other_local;
  Literal *this_local;
  
  iVar2 = geti32(this);
  iVar3 = geti32(other);
  bVar1 = add_sat_u<unsigned_char>((uchar)iVar2,(uchar)iVar3);
  Literal(__return_storage_ptr__,(uint)bVar1);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::addSatUI8(const Literal& other) const {
  return Literal(add_sat_u<uint8_t>(geti32(), other.geti32()));
}